

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::paintEvent(QLabel *this,QPaintEvent *param_1)

{
  State *this_00;
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  QLabelPrivate *this_01;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  LayoutDirection LVar8;
  Alignment AVar9;
  int iVar10;
  int iVar11;
  ColorRole CVar12;
  QStyle *pQVar13;
  QStyleSheetStyle *this_02;
  long *plVar14;
  QSize QVar15;
  QSize QVar16;
  long lVar17;
  undefined8 *puVar18;
  QStyleOption *pQVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long in_FS_OFFSET;
  byte bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  QRect QVar31;
  undefined1 auVar32 [16];
  int local_158;
  QSize local_110;
  QSize local_108;
  int local_100;
  int iStack_fc;
  int local_f8;
  int local_f4;
  QPainter painter;
  QRectF local_e8;
  QStyleOption opt_1;
  QStyleOption opt;
  
  bVar24 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  pQVar13 = QWidget::style((QWidget *)this);
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,&painter);
  QVar31 = QWidget::contentsRect((QWidget *)this);
  local_f4 = this_01->margin;
  local_100 = QVar31.x1.m_i.m_i + local_f4;
  iStack_fc = QVar31.y1.m_i.m_i + local_f4;
  local_f8 = QVar31.x2.m_i.m_i - local_f4;
  local_f4 = QVar31.y2.m_i.m_i - local_f4;
  if ((this_01->field_0x340 & 0x10) == 0) {
    LVar8 = QWidget::layoutDirection((QWidget *)this);
  }
  else {
    LVar8 = QLabelPrivate::textDirection(this_01);
  }
  AVar9 = QStyle::visualAlignment(LVar8,(Alignment)this_01->align);
  pDVar4 = (this_01->movie).wp.d;
  if (((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) ||
     ((this_01->movie).wp.value == (QObject *)0x0)) {
LAB_00410c69:
    if ((this_01->field_0x340 & 0x10) == 0) {
      if ((this_01->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
          super__Optional_payload<QPicture,_true,_false,_false>.
          super__Optional_payload_base<QPicture>._M_engaged == true) {
        auVar32 = QPicture::boundingRect();
        iVar23 = auVar32._0_4_;
        iVar22 = (auVar32._8_4_ - iVar23) + 1;
        iVar11 = auVar32._4_4_;
        iVar20 = (auVar32._12_4_ - iVar11) + 1;
        if ((this_01->field_0x340 & 2) == 0) {
          if ((char)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                    super_QFlagsStorage<Qt::AlignmentFlag>.i < '\0') {
            iVar20 = local_f4 - (iVar20 + iStack_fc);
            iVar10 = (iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1;
          }
          else {
            iVar10 = 0;
            if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) != 0) {
              iVar10 = (local_f4 - (iVar20 + iStack_fc)) + 1;
            }
          }
          if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) == 0) {
            iVar20 = 0;
            if (((uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 4) != 0) {
              iVar20 = local_f8 - (iVar22 + local_100);
              iVar20 = (iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1;
            }
          }
          else {
            iVar20 = (local_f8 - (iVar22 + local_100)) + 1;
          }
          if ((this_01->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
              super__Optional_payload<QPicture,_true,_false,_false>.
              super__Optional_payload_base<QPicture>._M_engaged == false) {
LAB_00411776:
            paintEvent();
LAB_0041177b:
            paintEvent();
            goto LAB_00411780;
          }
          opt._0_8_ = (BADTYPE)((iVar20 - iVar23) + local_100);
          opt._8_8_ = (BADTYPE)((iVar10 - iVar11) + iStack_fc);
          QPainter::drawPicture((QPointF *)&painter,(QPicture *)&opt);
        }
        else {
          QPainter::save();
          opt._0_8_ = (BADTYPE)local_100;
          opt._8_8_ = (BADTYPE)iStack_fc;
          QPainter::translate((QPointF *)&painter);
          QPainter::scale((double)((local_f8 - local_100) + 1) / (double)iVar22,
                          (double)((local_f4 - iStack_fc) + 1) / (double)iVar20);
          if ((this_01->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
              super__Optional_payload<QPicture,_true,_false,_false>.
              super__Optional_payload_base<QPicture>._M_engaged == false) {
            paintEvent();
            goto LAB_00411776;
          }
          opt._0_8_ = (BADTYPE)-iVar23;
          opt._8_8_ = (BADTYPE)-iVar11;
          QPainter::drawPicture((QPointF *)&painter,(QPicture *)&opt);
          QPainter::restore();
        }
      }
      else if ((this_01->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
               super__Optional_payload<QIcon,_true,_false,_false>.
               super__Optional_payload_base<QIcon>._M_engaged == true) {
        cVar7 = QIcon::isNull();
        if (cVar7 == '\0') {
          dVar28 = (double)QPaintDevice::devicePixelRatio();
          if ((this_01->field_0x340 & 2) == 0) {
            local_108 = this_01->pixmapSize;
          }
          else {
            local_108.wd.m_i = (local_f8 - local_100) + 1;
            local_108.ht.m_i = (local_f4 - iStack_fc) + 1;
          }
          uVar2 = ((this->super_QFrame).super_QWidget.data)->widget_attributes;
          opt_1.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          opt_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          opt_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          if ((this_01->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
              super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>
              ._M_engaged != false) {
            QIcon::pixmap((QSize *)&opt_1,dVar28,(int)this_01 + 0x2a0,(State)&local_108);
            if ((this_01->field_0x340 & 2) != 0) {
              QVar15 = (QSize)QPixmap::size();
              QVar16 = operator*(&local_108,dVar28);
              if (QVar15 != QVar16) {
                local_e8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_e8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_e8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                opt.rect._0_8_ = QPixmap::cacheKey();
                opt.version = 9;
                opt.type = 0;
                opt._8_8_ = anon_var_dwarf_b7bc59;
                opt.rect._8_8_ = CONCAT71(opt.rect._9_7_,(char)uVar2) & 0xffffffffffffff01;
                opt._32_4_ = local_108.wd.m_i;
                opt.palette.d = (QPalettePrivate *)CONCAT44(opt.palette.d._4_4_,local_108.ht.m_i);
                opt.palette.currentGroup._0_2_ =
                     (short)(int)((double)((ulong)(dVar28 * 1000.0) & 0x8000000000000000 |
                                          (ulong)DAT_006605c0) + dVar28 * 1000.0);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
                ::convertTo<QString>
                          ((QString *)&local_e8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_long_long>_>,_HexString<unsigned_char>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_short>_>
                            *)&opt);
                cVar7 = QPixmapCache::find((QString *)&local_e8,(QPixmap *)&opt_1);
                if (cVar7 == '\0') {
                  local_110 = operator*(&local_108,dVar28);
                  QPixmap::scaled((QSize *)&opt,(AspectRatioMode)&opt_1,
                                  (TransformationMode)&local_110);
                  QPixmap::operator=((QPixmap *)&opt_1,(QPixmap *)&opt);
                  QPixmap::~QPixmap((QPixmap *)&opt);
                  QPixmap::setDevicePixelRatio(dVar28);
                  QPixmapCache::insert((QString *)&local_e8,(QPixmap *)&opt_1);
                }
                if ((QArrayData *)local_e8.xp != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_e8.xp)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_e8.xp)->_q_value).super___atomic_base<int>._M_i +
                       -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_e8.xp)->_q_value).super___atomic_base<int>._M_i ==
                      0) {
                    QArrayData::deallocate((QArrayData *)local_e8.xp,2,0x10);
                  }
                }
              }
            }
            opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
            opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
            opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QStyleOption::QStyleOption(&opt,1,0);
            QStyleOption::initFrom(&opt,(QWidget *)this);
            pQVar19 = &opt_1;
            (**(code **)(*(long *)pQVar13 + 0xa0))
                      (pQVar13,&painter,&local_100,
                       AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i,pQVar19);
            QStyleOption::~QStyleOption(&opt);
            goto LAB_0041173d;
          }
          goto LAB_0041177b;
        }
      }
    }
    else {
      QLabelPrivate::layoutRect((QRectF *)&opt,this_01);
      auVar32 = QRectF::toAlignedRect();
      opt_1.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt_1._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt_1.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption(&opt_1,1,0);
      QStyleOption::initFrom(&opt_1,(QWidget *)this);
      this_02 = (QStyleSheetStyle *)
                QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
      if (this_02 != (QStyleSheetStyle *)0x0) {
        QStyleSheetStyle::styleSheetPalette(this_02,(QWidget *)this,&opt_1,&opt_1.palette);
      }
      dVar25 = (double)auVar32._0_4_;
      local_158 = auVar32._4_4_;
      dVar26 = (double)local_158;
      dVar28 = (double)(((long)auVar32._8_4_ - (long)auVar32._0_4_) + 1);
      dVar27 = (double)(((auVar32._8_8_ >> 0x20) - (auVar32._0_8_ >> 0x20)) + 1);
      if (this_01->control == (QWidgetTextControl *)0x0) {
        LVar8 = QLabelPrivate::textDirection(this_01);
        uVar21 = (uint)(LVar8 != LeftToRight) * 0x20000 + 0x20000 |
                 (uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i;
        if ((this_01->field_0x340 & 0x20) != 0) {
          iVar11 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x29,&opt_1,this,0);
          uVar21 = (uint)(iVar11 == 0) << 0xf | uVar21 | 0x800;
        }
        dVar29 = (double)((ulong)dVar25 & 0x8000000000000000 | 0x3fe0000000000000) + dVar25;
        bVar5 = 2147483647.0 < dVar29;
        if (dVar29 <= -2147483648.0) {
          dVar29 = -2147483648.0;
        }
        dVar30 = (double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar29);
        opt.version = (int)dVar30;
        dVar29 = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
        bVar5 = 2147483647.0 < dVar29;
        if (dVar29 <= -2147483648.0) {
          dVar29 = -2147483648.0;
        }
        dVar29 = (double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar29);
        iVar11 = (int)dVar29;
        dVar28 = (dVar25 - (double)(int)dVar30) * 0.5 + dVar28;
        dVar28 = (double)((ulong)dVar28 & 0x8000000000000000 | 0x3fe0000000000000) + dVar28;
        bVar5 = 2147483647.0 < dVar28;
        if (dVar28 <= -2147483648.0) {
          dVar28 = -2147483648.0;
        }
        dVar27 = (dVar26 - (double)(int)dVar29) * 0.5 + dVar27;
        dVar27 = (double)((ulong)dVar27 & 0x8000000000000000 | 0x3fe0000000000000) + dVar27;
        bVar6 = 2147483647.0 < dVar27;
        if (dVar27 <= -2147483648.0) {
          dVar27 = -2147483648.0;
        }
        opt.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar28) +
              opt.version + -1);
        opt.type = iVar11;
        opt.direction =
             ((int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 | ~-(ulong)bVar6 & (ulong)dVar27) +
             iVar11) - RightToLeft;
        uVar2 = ((this->super_QFrame).super_QWidget.data)->widget_attributes;
        CVar12 = QWidget::foregroundRole((QWidget *)this);
        (**(code **)(*(long *)pQVar13 + 0x98))
                  (pQVar13,&painter,&opt,uVar21,&opt_1.palette,(uVar2 & 1) == 0,&this_01->text,
                   CVar12);
      }
      else {
        iVar11 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x29,0,this,0);
        if (this_01->shortcutId != 0) {
          QTextCursor::charFormat();
          cVar7 = QTextCharFormat::fontUnderline();
          QTextFormat::~QTextFormat((QTextFormat *)&opt);
          if ((iVar11 != 0) != (bool)cVar7) {
            local_e8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            local_e8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_e8);
            ::QVariant::QVariant((QVariant *)&opt,(uint)(iVar11 != 0));
            QTextFormat::setProperty((int)&local_e8,(QVariant *)0x2023);
            ::QVariant::~QVariant((QVariant *)&opt);
            QTextCursor::mergeCharFormat((QTextCharFormat *)&this_01->shortcutCursor);
            QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
          }
        }
        QLabelPrivate::ensureTextLayouted(this_01);
        puVar18 = &DAT_006d6958;
        pQVar19 = &opt;
        for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
          uVar1 = *puVar18;
          pQVar19->version = (int)uVar1;
          pQVar19->type = (int)((ulong)uVar1 >> 0x20);
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          pQVar19 = (QStyleOption *)((long)pQVar19 + (ulong)bVar24 * -0x10 + 8);
        }
        opt.version = -1;
        this_00 = &opt.state;
        QPalette::QPalette((QPalette *)this_00);
        opt.styleObject = (QObject *)0x0;
        opt.palette.d = (QPalettePrivate *)0x0;
        opt.palette.currentGroup = Active;
        opt.palette._12_4_ = 0;
        opt.rect.x2.m_i = 0;
        opt.rect.y2.m_i = 0;
        opt.fontMetrics = (QFontMetrics)0x0;
        opt._33_7_ = 0;
        QPalette::operator=((QPalette *)this_00,&opt_1.palette);
        CVar12 = QWidget::foregroundRole((QWidget *)this);
        if ((CVar12 != Text) &&
           ((((this->super_QFrame).super_QWidget.data)->widget_attributes & 1) == 0)) {
          QWidget::foregroundRole((QWidget *)this);
          plVar14 = (long *)QPalette::brush((ColorGroup)this_00,Dark);
          QBrush::QBrush((QBrush *)&local_e8,(QColor *)(*plVar14 + 8),SolidPattern);
          QPalette::setBrush((ColorGroup)this_00,Mid,(QBrush *)0x6);
          QBrush::~QBrush((QBrush *)&local_e8);
        }
        QPainter::save();
        local_e8.xp = dVar25;
        local_e8.yp = dVar26;
        QPainter::translate((QPointF *)&painter);
        local_e8.xp = dVar25 - dVar25;
        local_e8.yp = dVar26 - dVar26;
        local_e8.w = dVar28;
        local_e8.h = dVar27;
        QPainter::setClipRect((QRectF *)&painter,(ClipOperation)&local_e8);
        QWidgetTextControl::setPalette((QWidgetTextControl *)this_01->control,(QPalette *)this_00);
        local_e8.w = 0.0;
        local_e8.h = 0.0;
        local_e8.xp = 0.0;
        local_e8.yp = 0.0;
        QWidgetTextControl::drawContents
                  ((QWidgetTextControl *)this_01->control,&painter,&local_e8,(QWidget *)this);
        QPainter::restore();
        QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                  ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)&opt.styleObject);
        QPalette::~QPalette((QPalette *)this_00);
      }
      QStyleOption::~QStyleOption(&opt_1);
    }
  }
  else {
    QMovie::currentPixmap();
    cVar7 = QPixmap::isNull();
    QPixmap::~QPixmap((QPixmap *)&opt);
    if (cVar7 != '\0') goto LAB_00410c69;
    if ((this_01->field_0x340 & 2) == 0) {
      pQVar19 = &opt;
      QMovie::currentPixmap();
      (**(code **)(*(long *)pQVar13 + 0xa0))
                (pQVar13,&painter,&local_100,
                 AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i,pQVar19);
    }
    else {
      pQVar19 = &opt_1;
      QMovie::currentPixmap();
      local_e8.xp = (qreal)CONCAT44((local_f4 - iStack_fc) + 1,(local_f8 - local_100) + 1);
      QPixmap::scaled((QSize *)&opt,(AspectRatioMode)pQVar19,(TransformationMode)&local_e8);
      (**(code **)(*(long *)pQVar13 + 0xa0))
                (pQVar13,&painter,&local_100,
                 AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i,&opt);
      QPixmap::~QPixmap((QPixmap *)&opt);
    }
LAB_0041173d:
    QPixmap::~QPixmap((QPixmap *)pQVar19);
  }
  QPainter::~QPainter(&painter);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
LAB_00411780:
  __stack_chk_fail();
}

Assistant:

void QLabel::paintEvent(QPaintEvent *)
{
    Q_D(QLabel);
    QStyle *style = QWidget::style();
    QPainter painter(this);
    drawFrame(&painter);
    QRect cr = contentsRect();
    cr.adjust(d->margin, d->margin, -d->margin, -d->margin);
    int align = QStyle::visualAlignment(d->isTextLabel ? d->textDirection()
                                                       : layoutDirection(), QFlag(d->align));

#if QT_CONFIG(movie)
    if (d->movie && !d->movie->currentPixmap().isNull()) {
        if (d->scaledcontents)
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap().scaled(cr.size()));
        else
            style->drawItemPixmap(&painter, cr, align, d->movie->currentPixmap());
    }
    else
#endif
    if (d->isTextLabel) {
        QRectF lr = d->layoutRect().toAlignedRect();
        QStyleOption opt;
        opt.initFrom(this);
#ifndef QT_NO_STYLE_STYLESHEET
        if (QStyleSheetStyle* cssStyle = qt_styleSheet(style))
            cssStyle->styleSheetPalette(this, &opt, &opt.palette);
#endif
        if (d->control) {
#ifndef QT_NO_SHORTCUT
            const bool underline = static_cast<bool>(style->styleHint(QStyle::SH_UnderlineShortcut,
                                                                      nullptr, this, nullptr));
            if (d->shortcutId != 0
                && underline != d->shortcutCursor.charFormat().fontUnderline()) {
                QTextCharFormat fmt;
                fmt.setFontUnderline(underline);
                d->shortcutCursor.mergeCharFormat(fmt);
            }
#endif
            d->ensureTextLayouted();

            QAbstractTextDocumentLayout::PaintContext context;
            // Adjust the palette
            context.palette = opt.palette;

            if (foregroundRole() != QPalette::Text && isEnabled())
                context.palette.setColor(QPalette::Text, context.palette.color(foregroundRole()));

            painter.save();
            painter.translate(lr.topLeft());
            painter.setClipRect(lr.translated(-lr.x(), -lr.y()));
            d->control->setPalette(context.palette);
            d->control->drawContents(&painter, QRectF(), this);
            painter.restore();
        } else {
            int flags = align | (d->textDirection() == Qt::LeftToRight ? Qt::TextForceLeftToRight
                                                                       : Qt::TextForceRightToLeft);
            if (d->hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                if (!style->styleHint(QStyle::SH_UnderlineShortcut, &opt, this))
                    flags |= Qt::TextHideMnemonic;
            }
            style->drawItemText(&painter, lr.toRect(), flags, opt.palette, isEnabled(), d->text, foregroundRole());
        }
    } else
#ifndef QT_NO_PICTURE
    if (d->picture) {
        QRect br = d->picture->boundingRect();
        int rw = br.width();
        int rh = br.height();
        if (d->scaledcontents) {
            painter.save();
            painter.translate(cr.x(), cr.y());
            painter.scale((double)cr.width()/rw, (double)cr.height()/rh);
            painter.drawPicture(-br.x(), -br.y(), *d->picture);
            painter.restore();
        } else {
            int xo = 0;
            int yo = 0;
            if (align & Qt::AlignVCenter)
                yo = (cr.height()-rh)/2;
            else if (align & Qt::AlignBottom)
                yo = cr.height()-rh;
            if (align & Qt::AlignRight)
                xo = cr.width()-rw;
            else if (align & Qt::AlignHCenter)
                xo = (cr.width()-rw)/2;
            painter.drawPicture(cr.x()+xo-br.x(), cr.y()+yo-br.y(), *d->picture);
        }
    } else
#endif
    if (d->icon && !d->icon->isNull()) {
        const qreal dpr = devicePixelRatio();
        const QSize size = d->scaledcontents ? cr.size() : d->pixmapSize;
        const auto mode = isEnabled() ? QIcon::Normal : QIcon::Disabled;
        QPixmap pix = d->icon->pixmap(size, dpr, mode);
        if (d->scaledcontents && pix.size() != size * dpr) {
            const QString key = "qt_label_"_L1 % HexString<quint64>(pix.cacheKey())
                                               % HexString<quint8>(mode)
                                               % HexString<uint>(size.width())
                                               % HexString<uint>(size.height())
                                               % HexString<quint16>(qRound(dpr * 1000));
            if (!QPixmapCache::find(key, &pix)) {
                pix = pix.scaled(size * dpr, Qt::IgnoreAspectRatio, Qt::SmoothTransformation);
                pix.setDevicePixelRatio(dpr);
                // using QIcon to cache the newly create pixmap is not possible
                // because QIcon does not clear this cache (so we grow indefinitely)
                // and also uses the newly added pixmap as starting point for new
                // scaled pixmap which makes it very blurry.
                // Therefore use QPixmapCache here.
                QPixmapCache::insert(key, pix);
            }
        }
        QStyleOption opt;
        opt.initFrom(this);
        style->drawItemPixmap(&painter, cr, align, pix);
    }
}